

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O3

Span<Potassco::WeightLit_t> __thiscall
Potassco::SmodelsConvert::SmData::mapLits<Potassco::WeightLit_t>
          (SmData *this,Span<Potassco::WeightLit_t> *in,
          vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_> *out)

{
  WeightLit_t WVar1;
  uint uVar2;
  WeightLit_t in_RAX;
  Atom *pAVar3;
  pointer pWVar4;
  pointer pWVar5;
  pointer pWVar6;
  Atom_t AVar7;
  Atom_t a;
  pointer pWVar8;
  WeightLit_t *pWVar9;
  Span<Potassco::WeightLit_t> SVar10;
  WeightLit_t local_38;
  
  pWVar5 = (out->super__Vector_base<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((out->super__Vector_base<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>).
      _M_impl.super__Vector_impl_data._M_finish != pWVar5) {
    (out->super__Vector_base<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>)._M_impl
    .super__Vector_impl_data._M_finish = pWVar5;
  }
  pWVar8 = pWVar5;
  if (in->size != 0) {
    pWVar9 = in->first;
    local_38 = in_RAX;
    do {
      WVar1 = *pWVar9;
      AVar7 = WVar1.lit;
      a = -AVar7;
      if (0 < (int)AVar7) {
        a = AVar7;
      }
      pAVar3 = mapAtom(this,a);
      uVar2 = -((uint)*pAVar3 & 0xfffffff);
      if (-1 < (int)AVar7) {
        uVar2 = (uint)*pAVar3 & 0xfffffff;
      }
      local_38 = (WeightLit_t)((ulong)uVar2 | (ulong)WVar1 & 0xffffffff00000000);
      std::vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>::
      emplace_back<Potassco::WeightLit_t>(out,&local_38);
      pWVar9 = pWVar9 + 1;
    } while (pWVar9 != in->first + in->size);
    pWVar8 = (out->super__Vector_base<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pWVar5 = (out->super__Vector_base<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  }
  pWVar4 = pWVar8;
  if ((long)pWVar5 - (long)pWVar8 == 0) {
    pWVar4 = (pointer)0x0;
  }
  pWVar6 = (pointer)((long)pWVar5 - (long)pWVar8 >> 3);
  if (pWVar5 == pWVar8) {
    pWVar6 = (pointer)0x0;
  }
  SVar10.size = (size_t)pWVar6;
  SVar10.first = pWVar4;
  return SVar10;
}

Assistant:

Span<T>  mapLits(const Span<T>& in, std::vector<T>& out) {
		out.clear();
		for (typename Span<T>::iterator x = begin(in); x != end(in); ++x) { out.push_back(mapLit(*x)); }
		return toSpan(out);
	}